

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderQuadsDegenerateCase::initTest(TessellationShaderQuadsDegenerateCase *this)

{
  float vertex_spacing;
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar5;
  TestError *this_03;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  vector<char,_std::allocator<char>_> local_280;
  MessageBuilder local_268;
  undefined1 local_e8 [8];
  string vs_mode_string;
  _run run;
  GLint tess_level;
  uint n_tess_level;
  _tessellation_shader_vertex_spacing vs_mode;
  uint n_vs_mode;
  bool has_failed;
  uint n_vs_modes;
  _tessellation_shader_vertex_spacing vs_modes [3];
  uint n_tess_levels;
  GLint tess_levels [3];
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderQuadsDegenerateCase *local_10;
  TessellationShaderQuadsDegenerateCase *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  register0x00000000 = (Functions *)CONCAT44(extraout_var,iVar2);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils
            (this_01,stack0xffffffffffffffb0,&this->super_TestCaseBase);
  this->m_utils = this_01;
  (*stack0xffffffffffffffb0->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*stack0xffffffffffffffb0->getError)();
  glu::checkError(GVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x73);
  (*stack0xffffffffffffffb0->bindVertexArray)(this->m_vao_id);
  GVar3 = (*stack0xffffffffffffffb0->getError)();
  glu::checkError(GVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x76);
  tess_levels[1] = 0;
  (*stack0xffffffffffffffb0->getIntegerv)
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,tess_levels + 1);
  GVar3 = (*stack0xffffffffffffffb0->getError)();
  glu::checkError(GVar3,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x7c);
  vs_modes[2] = -tess_levels[1] / 2;
  tess_levels[0] = 1;
  vs_modes[1] = TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT;
  vs_modes[0] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD;
  bVar1 = false;
  for (n_tess_level = 0; n_tess_level < 3; n_tess_level = n_tess_level + 1) {
    vertex_spacing = (float)tess_levels[(ulong)n_tess_level - 6];
    for (run._60_4_ = 0; (uint)run._60_4_ < 3; run._60_4_ = run._60_4_ + 1) {
      run.n_vertices = vs_modes[(ulong)(uint)run._60_4_ + 2];
      _run::_run((_run *)((long)&vs_mode_string.field_2 + 8));
      vs_mode_string.field_2._8_4_ = (undefined4)(int)run.n_vertices;
      vs_mode_string.field_2._12_4_ = (undefined4)(int)run.n_vertices;
      if ((int)run.n_vertices < 0) {
        local_2a4 = 1;
      }
      else {
        local_2a4 = run.n_vertices;
      }
      run.inner[0] = (float)(int)local_2a4;
      if ((int)run.n_vertices < 0) {
        local_2a8 = 1;
      }
      else {
        local_2a8 = run.n_vertices;
      }
      run.inner[1] = (float)(int)local_2a8;
      if ((int)run.n_vertices < 0) {
        local_2ac = 1;
      }
      else {
        local_2ac = run.n_vertices;
      }
      run.outer[0] = (float)(int)local_2ac;
      if ((int)run.n_vertices < 0) {
        local_2b0 = 1;
      }
      else {
        local_2b0 = run.n_vertices;
      }
      run.outer[1] = (float)(int)local_2b0;
      run.outer[2] = vertex_spacing;
      run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
           TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                     (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
                      (float *)((long)&vs_mode_string.field_2 + 8),run.inner,
                      (_tessellation_shader_vertex_spacing)vertex_spacing,false);
      if (run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  ((string *)local_e8,(TessellationShaderUtils *)(ulong)(uint)vertex_spacing,
                   vertex_spacing_00);
        this_02 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_268,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_268,
                            (char (*) [67])
                            "No vertices were generated by tessellator for: inner tess levels:[");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(float *)((long)&vs_mode_string.field_2 + 8));
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(float *)((long)&vs_mode_string.field_2 + 0xc));
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [23])"], outer tess levels:[");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.inner);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.inner + 1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.outer);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.outer + 1);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [43])"], primitive mode: quads, vertex spacing: ");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_e8);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_268);
        bVar1 = true;
        std::__cxx11::string::~string((string *)local_e8);
      }
      else {
        TessellationShaderUtils::getDataGeneratedByTessellator
                  (&local_280,this->m_utils,(float *)((long)&vs_mode_string.field_2 + 8),false,
                   TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
                   (_tessellation_shader_vertex_spacing)run.outer[2],run.inner);
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)&run.vertex_spacing,&local_280);
        std::vector<char,_std::allocator<char>_>::~vector(&local_280);
      }
      std::
      vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
      ::push_back(&this->m_runs,(value_type *)((long)&vs_mode_string.field_2 + 8));
      _run::~_run((_run *)((long)&vs_mode_string.field_2 + 8));
    }
  }
  if (bVar1) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,
               "Zero vertices were generated by tessellator for at least one run which is not a correct behavior"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
               ,0xce);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TessellationShaderQuadsDegenerateCase::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	const glw::GLint   tess_levels[] = { -gl_max_tess_gen_level_value / 2, -1, 1 };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	const _tessellation_shader_vertex_spacing vs_modes[] = {
		/* NOTE: We do not check "fractional even" vertex spacing since it will always
		 *       clamp to 2 which is out of scope for this test.
		 */
		TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT,
		TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
	};
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	/* Iterate through all vertex spacing modes */
	bool has_failed = false;

	for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
	{
		_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

		/* Iterate through all values that should be used for irrelevant tessellation levels */
		for (unsigned int n_tess_level = 0; n_tess_level < n_tess_levels; ++n_tess_level)
		{
			const glw::GLint tess_level = tess_levels[n_tess_level];

			/* Set up the run descriptor.
			 *
			 * Round outer tesellation levels to 1 if necessary, since otherwise no geometry will
			 * be generated.
			 **/
			_run run;

			run.inner[0]	   = (float)tess_level;
			run.inner[1]	   = (float)tess_level;
			run.outer[0]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[1]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[2]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[3]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.vertex_spacing = vs_mode;

			/* Retrieve vertex data for both passes */
			run.n_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS, run.inner, run.outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */

			if (run.n_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.inner[0] << ", " << run.inner[1] << "]"
																			  ", outer tess levels:"
																			  "["
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << "]"
													  ", primitive mode: quads, "
													  "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				has_failed = true;
			}
			else
			{
				/* Retrieve the data buffers */
				run.data = m_utils->getDataGeneratedByTessellator(run.inner, false, /* is_point_mode_enabled */
																  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
																  TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																  run.vertex_spacing, run.outer);
			}

			/* Store the run data */
			m_runs.push_back(run);
		} /* for (all tessellation levels) */
	}	 /* for (all vertex spacing modes) */

	if (has_failed)
	{
		TCU_FAIL("Zero vertices were generated by tessellator for at least one run which is not "
				 "a correct behavior");
	}
}